

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRotationZ.cpp
# Opt level: O2

void __thiscall
qclab::qgates::CRotationZ<std::complex<double>_>::apply
          (CRotationZ<std::complex<double>_> *this,Op op,int nbQubits,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vector,int offset)

{
  double dVar1;
  int iVar2;
  RotationZ<std::complex<double>_> *pRVar3;
  int iVar4;
  vector<int,_std::allocator<int>_> qubits;
  anon_class_40_3_96b6a9c1 f;
  _Vector_base<int,_std::allocator<int>_> local_70;
  undefined1 local_58 [32];
  double local_38;
  
  (*(this->super_QControlledGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
    super_QObject<std::complex<double>_>._vptr_QObject[5])(&local_70,this);
  *(ulong *)local_70._M_impl.super__Vector_impl_data._M_start =
       CONCAT44(offset + (int)((ulong)*(undefined8 *)
                                       local_70._M_impl.super__Vector_impl_data._M_start >> 0x20),
                offset + (int)*(undefined8 *)local_70._M_impl.super__Vector_impl_data._M_start);
  iVar2 = (this->super_QControlledGate2<std::complex<double>_>).control_;
  iVar4 = (*(this->super_QControlledGate2<std::complex<double>_>).
            super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject
            [0xf])(this);
  pRVar3 = (this->gate_)._M_t.
           super___uniq_ptr_impl<qclab::qgates::RotationZ<std::complex<double>_>,_std::default_delete<qclab::qgates::RotationZ<std::complex<double>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_qclab::qgates::RotationZ<std::complex<double>_>_*,_std::default_delete<qclab::qgates::RotationZ<std::complex<double>_>_>_>
           .super__Head_base<0UL,_qclab::qgates::RotationZ<std::complex<double>_>_*,_false>.
           _M_head_impl;
  local_58._8_8_ = (pRVar3->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.cos_;
  dVar1 = (pRVar3->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.sin_;
  local_58._0_8_ =
       (vector->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  local_38 = -dVar1;
  local_58._16_8_ = dVar1;
  if (op != ConjTrans) {
    local_58._16_8_ = local_38;
    local_38 = dVar1;
  }
  local_58._24_8_ = local_58._8_8_;
  apply4<qclab::qgates::lambda_RotationZ<std::complex<double>,double>(qclab::Op,double,double,std::complex<double>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,*local_70._M_impl.super__Vector_impl_data._M_start,
             local_70._M_impl.super__Vector_impl_data._M_start[1],iVar2 + offset,iVar4 + offset,
             (this->super_QControlledGate2<std::complex<double>_>).controlState_,
             (anon_class_40_3_96b6a9c1 *)local_58);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_70);
  return;
}

Assistant:

void CRotationZ< T >::apply( Op op , const int nbQubits ,
                               std::vector< T >& vector ,
                               const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    const int control = this->control() + offset ;
    const int target  = this->target()  + offset ;
    auto f = lambda_RotationZ( op , this->cos() , this->sin() , vector.data() );
    apply4( nbQubits , qubits[0] , qubits[1] , control , target ,
            this->controlState() , f ) ;
  }